

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O0

void Imf_2_5::RgbaYca::anon_unknown_9::desaturate(Rgba *in,float f,V3f *yw,Rgba *out)

{
  half *this;
  half *in_RDX;
  float *in_RSI;
  half *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float Yout;
  float Yin;
  float rgbMax;
  float in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  float fVar5;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  half *local_20;
  float *local_18;
  float local_c;
  half *local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_c = in_XMM0_Da;
  local_8 = in_RDI;
  std::max<half>((half *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),in_RDI);
  this = std::max<half>((half *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),in_RDI
                       );
  fVar1 = half::operator_cast_to_float(this);
  fVar5 = fVar1;
  local_24 = fVar1;
  fVar2 = half::operator_cast_to_float(local_8);
  local_28 = -(fVar1 - fVar2) * local_c + fVar5;
  local_2c = 0.0;
  std::max<float>(&local_28,&local_2c);
  half::operator=(in_RDI,in_stack_ffffffffffffff7c);
  fVar5 = local_24;
  fVar1 = half::operator_cast_to_float(local_8 + 1);
  local_30 = -(fVar5 - fVar1) * local_c + fVar5;
  local_34 = 0.0;
  std::max<float>(&local_30,&local_34);
  half::operator=(in_RDI,in_stack_ffffffffffffff7c);
  fVar5 = local_24;
  fVar1 = half::operator_cast_to_float(local_8 + 2);
  local_38 = -(fVar5 - fVar1) * local_c + fVar5;
  local_3c = 0.0;
  std::max<float>(&local_38,&local_3c);
  half::operator=(in_RDI,in_stack_ffffffffffffff7c);
  local_20[3]._h = local_8[3]._h;
  half::operator_cast_to_float(local_8);
  half::operator_cast_to_float(local_8 + 1);
  half::operator_cast_to_float(local_8 + 2);
  fVar2 = half::operator_cast_to_float(local_20);
  fVar5 = *local_18;
  fVar3 = half::operator_cast_to_float(local_20 + 1);
  fVar1 = local_18[1];
  fVar4 = half::operator_cast_to_float(local_20 + 2);
  if (0.0 < fVar4 * local_18[2] + fVar2 * fVar5 + fVar3 * fVar1) {
    half::operator*=(in_RDI,in_stack_ffffffffffffff7c);
    half::operator*=(in_RDI,in_stack_ffffffffffffff7c);
    half::operator*=(in_RDI,in_stack_ffffffffffffff7c);
  }
  return;
}

Assistant:

void
desaturate (const Rgba &in, float f, const V3f &yw, Rgba &out)
{
    float rgbMax = max (in.r, max (in.g, in.b));

    out.r = max (float (rgbMax - (rgbMax - in.r) * f), 0.0f);
    out.g = max (float (rgbMax - (rgbMax - in.g) * f), 0.0f);
    out.b = max (float (rgbMax - (rgbMax - in.b) * f), 0.0f);
    out.a = in.a;

    float Yin  = in.r  * yw.x + in.g  * yw.y + in.b  * yw.z;
    float Yout = out.r * yw.x + out.g * yw.y + out.b * yw.z;

    if (Yout > 0)
    {
	out.r *= Yin / Yout;
	out.g *= Yin / Yout;
	out.b *= Yin / Yout;
    }
}